

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_util.h
# Opt level: O0

void * cppcms::impl::mmap_anonymous(size_t size)

{
  int *piVar1;
  undefined8 uVar2;
  size_t in_RDI;
  string *in_stack_00000010;
  int in_stack_0000001c;
  cppcms_error *in_stack_00000020;
  int err;
  void *p;
  allocator local_39;
  string local_38 [36];
  int local_14;
  void *local_10;
  
  local_10 = mmap((void *)0x0,in_RDI,3,0x21,-1,0);
  piVar1 = __errno_location();
  local_14 = *piVar1;
  if (local_10 == (void *)0xffffffffffffffff) {
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Failed to create shared memory",&local_39);
    cppcms_error::cppcms_error(in_stack_00000020,in_stack_0000001c,in_stack_00000010);
    __cxa_throw(uVar2,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  return local_10;
}

Assistant:

inline void *mmap_anonymous(size_t size)
	{
		#if defined(MAP_ANONYMOUS)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANONYMOUS | MAP_SHARED, -1, 0);
		int err=errno;
		#elif defined(MAP_ANON)
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE, MAP_ANON | MAP_SHARED, -1, 0);
		int err=errno;
		#else
		int fd=::open("/dev/null",O_RDWR);
		if(fd < 0) 
			throw cppcms_error(errno,"Failed to open /dev/null");
		void *p=::mmap(0,size,PROT_READ | PROT_WRITE,MAP_SHARED, fd, 0);
		int err=errno;
		::close(fd);
		#endif
		if(p==MAP_FAILED)
			throw cppcms_error(err,"Failed to create shared memory");
		return p;
	}